

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

void us_internal_loop_unlink(us_loop_t *loop,us_socket_context_t *context)

{
  us_socket_context_t *context_local;
  us_loop_t *loop_local;
  
  if ((loop->data).head == context) {
    (loop->data).head = context->next;
    if ((loop->data).head != (us_socket_context_t *)0x0) {
      ((loop->data).head)->prev = (us_socket_context_t *)0x0;
    }
  }
  else {
    context->prev->next = context->next;
    if (context->next != (us_socket_context_t *)0x0) {
      context->next->prev = context->prev;
    }
  }
  return;
}

Assistant:

void us_internal_loop_unlink(struct us_loop_t *loop, struct us_socket_context_t *context) {
    if (loop->data.head == context) {
        loop->data.head = context->next;
        if (loop->data.head) {
            loop->data.head->prev = 0;
        }
    } else {
        context->prev->next = context->next;
        if (context->next) {
            context->next->prev = context->prev;
        }
    }
}